

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary_impl.h
# Opt level: O3

int __thiscall
label::LabelDictionary<label::StringLabel>::insert
          (LabelDictionary<label::StringLabel> *this,StringLabel *l)

{
  pointer pcVar1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_false>,_bool>
  pVar2;
  long *local_50 [2];
  long local_40 [2];
  int local_30;
  
  pcVar1 = (l->label_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (l->label_)._M_string_length);
  local_30 = this->labels_count_;
  pVar2 = std::
          _Hashtable<label::StringLabel,std::pair<label::StringLabel_const,int>,std::allocator<std::pair<label::StringLabel_const,int>>,std::__detail::_Select1st,std::equal_to<label::StringLabel>,std::hash<label::StringLabel>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<label::StringLabel_const,int>>
                    ((_Hashtable<label::StringLabel,std::pair<label::StringLabel_const,int>,std::allocator<std::pair<label::StringLabel_const,int>>,std::__detail::_Select1st,std::equal_to<label::StringLabel>,std::hash<label::StringLabel>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::push_back
              (&this->id_to_label_dictionary_,l);
    this->labels_count_ = this->labels_count_ + 1;
  }
  return *(int *)((long)pVar2.first.
                        super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false>.
                        _M_cur.
                        super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false> +
                 0x28);
}

Assistant:

int LabelDictionary<Label>::insert(const Label& l) {
  // Try to insert the given label with labels_count as its id value.
  // If the label is already in the dictionary, it (and its id) will not be
  // overwritten.
  auto label_in_dictionary = label_to_id_dictionary_.insert({l, labels_count_});
  // If the label wasn't in the dictionary, it was inserted.
  // Increase the labels count for consecutive labels.
  if (label_in_dictionary.second) {
    // Add the label at the corresponding index.
    id_to_label_dictionary_.push_back(l);
    ++labels_count_;
  }
  // Return the id of the given label.
  return label_in_dictionary.first->second;
}